

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O2

int nni_posix_resolv_sysinit(nng_init_params *params)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  int i;
  void *arg;
  long lVar5;
  
  nni_mtx_init(&resolv_mtx);
  nni_cv_init(&resolv_cv,&resolv_mtx);
  resolv_fini = 0;
  nni_aio_list_init(&resolv_aios);
  uVar3 = 1;
  if (1 < params->num_resolver_threads) {
    uVar3 = params->num_resolver_threads;
  }
  resolv_num_thr = uVar3;
  params->num_resolver_threads = uVar3;
  resolv_thrs = (nni_thr *)nni_zalloc((ulong)uVar3 * 0x98);
  resolv_active = (nni_aio **)nni_zalloc((long)resolv_num_thr << 3);
  if (resolv_active == (nni_aio **)0x0 || resolv_thrs == (nni_thr *)0x0) {
    iVar1 = 2;
  }
  else {
    lVar4 = 0;
    arg = (void *)0x0;
    do {
      uVar2 = (ulong)resolv_num_thr;
      if ((long)uVar2 <= (long)arg) {
        lVar4 = 0;
        for (lVar5 = 0; lVar5 < (short)uVar2; lVar5 = lVar5 + 1) {
          nni_thr_run((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar4));
          uVar2 = (ulong)(ushort)resolv_num_thr;
          lVar4 = lVar4 + 0x98;
        }
        return 0;
      }
      iVar1 = nni_thr_init((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar4),resolv_worker,arg);
      arg = (void *)((long)arg + 1);
      lVar4 = lVar4 + 0x98;
    } while (iVar1 == 0);
  }
  nni_posix_resolv_sysfini();
  return iVar1;
}

Assistant:

int
nni_posix_resolv_sysinit(nng_init_params *params)
{
	nni_mtx_init(&resolv_mtx);
	nni_cv_init(&resolv_cv, &resolv_mtx);
	resolv_fini = false;
	nni_aio_list_init(&resolv_aios);

	resolv_num_thr = params->num_resolver_threads;
	if (resolv_num_thr < 1) {
		resolv_num_thr = 1;
	}
	params->num_resolver_threads = resolv_num_thr;
	// no limit on the maximum for now
	resolv_thrs   = NNI_ALLOC_STRUCTS(resolv_thrs, resolv_num_thr);
	resolv_active = nni_zalloc(sizeof(nni_aio *) * resolv_num_thr);
	if (resolv_thrs == NULL || resolv_active == NULL) {
		nni_posix_resolv_sysfini();
		return (NNG_ENOMEM);
	}

	for (int i = 0; i < resolv_num_thr; i++) {
		int rv = nni_thr_init(
		    &resolv_thrs[i], resolv_worker, (void *) (intptr_t) i);
		if (rv != 0) {
			nni_posix_resolv_sysfini();
			return (rv);
		}
	}
	for (int i = 0; i < resolv_num_thr; i++) {
		nni_thr_run(&resolv_thrs[i]);
	}

	return (0);
}